

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_list.cpp
# Opt level: O0

iterator __thiscall
spvtools::opt::InstructionList::iterator::InsertBefore
          (iterator *this,
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          *i)

{
  pointer pIVar1;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *in_RDX;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *i_local;
  iterator *this_local;
  
  pIVar1 = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::get(in_RDX);
  utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
            (&pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>,
             (i->_M_t).
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
  pIVar1 = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::release(in_RDX);
  iterator(this,pIVar1);
  return (iterator)(iterator)this;
}

Assistant:

InstructionList::iterator InstructionList::iterator::InsertBefore(
    std::unique_ptr<Instruction>&& i) {
  i.get()->InsertBefore(node_);
  return iterator(i.release());
}